

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx512::DiscMiMBIntersectorK<4,_16,_true>::occluded
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *Disc
               )

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  byte bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar58 [16];
  undefined4 uVar59;
  undefined1 auVar60 [16];
  float fVar61;
  float fVar63;
  float fVar64;
  undefined1 auVar62 [16];
  float fVar65;
  undefined1 auVar66 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_3e0;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [16];
  float local_370 [4];
  float local_360 [4];
  float local_350 [4];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar57 [64];
  
  pSVar6 = context->scene;
  pGVar7 = (pSVar6->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar7->time_range).lower;
  uVar36 = (ulong)(Disc->primIDs).field_0.i[0];
  fVar27 = pGVar7->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x1c0) - fVar1) / ((pGVar7->time_range).upper - fVar1));
  auVar47 = vroundss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27),9);
  auVar47 = vminss_avx(auVar47,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar39 = vmaxss_avx(ZEXT816(0) << 0x20,auVar47);
  lVar8 = *(long *)&pGVar7[2].numPrimitives;
  lVar33 = (long)(int)auVar39._0_4_ * 0x38;
  lVar9 = *(long *)(lVar8 + lVar33);
  lVar10 = *(long *)(lVar8 + 0x10 + lVar33);
  auVar47 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar36);
  uVar34 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar48 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar34);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar40 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar32);
  uVar35 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar49 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar35);
  lVar9 = *(long *)(lVar8 + 0x38 + lVar33);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar33);
  auVar51 = *(undefined1 (*) [16])(lVar9 + uVar36 * lVar8);
  auVar4 = *(undefined1 (*) [16])(lVar9 + uVar34 * lVar8);
  auVar42 = *(undefined1 (*) [16])(lVar9 + uVar32 * lVar8);
  auVar5 = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar35);
  fVar27 = fVar27 - auVar39._0_4_;
  auVar39 = vunpcklps_avx(auVar47,auVar40);
  auVar47 = vunpckhps_avx(auVar47,auVar40);
  auVar40 = vunpcklps_avx(auVar48,auVar49);
  auVar48 = vunpckhps_avx(auVar48,auVar49);
  auVar28 = vunpcklps_avx(auVar39,auVar40);
  auVar40 = vunpckhps_avx(auVar39,auVar40);
  auVar39 = vunpcklps_avx(auVar47,auVar48);
  auVar41 = vunpcklps_avx(auVar51,auVar42);
  auVar49 = vunpckhps_avx(auVar51,auVar42);
  auVar42 = vunpcklps_avx(auVar4,auVar5);
  auVar51 = vunpckhps_avx(auVar4,auVar5);
  auVar5 = vunpcklps_avx(auVar41,auVar42);
  auVar4 = vunpckhps_avx(auVar41,auVar42);
  auVar42 = vunpcklps_avx(auVar49,auVar51);
  fVar1 = 1.0 - fVar27;
  auVar58._4_4_ = fVar1;
  auVar58._0_4_ = fVar1;
  auVar58._8_4_ = fVar1;
  auVar58._12_4_ = fVar1;
  auVar41._0_4_ = fVar27 * auVar5._0_4_;
  auVar41._4_4_ = fVar27 * auVar5._4_4_;
  auVar41._8_4_ = fVar27 * auVar5._8_4_;
  auVar41._12_4_ = fVar27 * auVar5._12_4_;
  auVar60._0_4_ = fVar27 * auVar4._0_4_;
  auVar60._4_4_ = fVar27 * auVar4._4_4_;
  auVar60._8_4_ = fVar27 * auVar4._8_4_;
  auVar60._12_4_ = fVar27 * auVar4._12_4_;
  auVar62._0_4_ = fVar27 * auVar42._0_4_;
  auVar62._4_4_ = fVar27 * auVar42._4_4_;
  auVar62._8_4_ = fVar27 * auVar42._8_4_;
  auVar62._12_4_ = fVar27 * auVar42._12_4_;
  auVar4 = vfmadd231ps_fma(auVar41,auVar58,auVar28);
  auVar42 = vfmadd231ps_fma(auVar60,auVar58,auVar40);
  auVar5 = vfmadd231ps_fma(auVar62,auVar58,auVar39);
  local_3b0 = vpbroadcastd_avx512vl();
  fVar1 = *(float *)(ray + k * 4 + 0x100);
  auVar45._4_4_ = fVar1;
  auVar45._0_4_ = fVar1;
  auVar45._8_4_ = fVar1;
  auVar45._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x140);
  auVar46._4_4_ = fVar2;
  auVar46._0_4_ = fVar2;
  auVar46._8_4_ = fVar2;
  auVar46._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x180);
  auVar40 = vfmadd231ps_fma(ZEXT416((uint)(fVar3 * fVar3)),auVar46,auVar46);
  auVar40 = vfmadd231ps_fma(auVar40,auVar45,auVar45);
  uVar59 = auVar40._0_4_;
  auVar66._4_4_ = uVar59;
  auVar66._0_4_ = uVar59;
  auVar66._8_4_ = uVar59;
  auVar66._12_4_ = uVar59;
  auVar39 = vrcp14ps_avx512vl(auVar66);
  auVar40._8_4_ = 0x3f800000;
  auVar40._0_8_ = &DAT_3f8000003f800000;
  auVar40._12_4_ = 0x3f800000;
  auVar40 = vfnmadd213ps_avx512vl(auVar66,auVar39,auVar40);
  auVar40 = vfmadd132ps_fma(auVar40,auVar39,auVar39);
  uVar59 = *(undefined4 *)(ray + k * 4);
  auVar39._4_4_ = uVar59;
  auVar39._0_4_ = uVar59;
  auVar39._8_4_ = uVar59;
  auVar39._12_4_ = uVar59;
  auVar39 = vsubps_avx512vl(auVar4,auVar39);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar4._4_4_ = uVar59;
  auVar4._0_4_ = uVar59;
  auVar4._8_4_ = uVar59;
  auVar4._12_4_ = uVar59;
  auVar41 = vsubps_avx512vl(auVar42,auVar4);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar42._4_4_ = uVar59;
  auVar42._0_4_ = uVar59;
  auVar42._8_4_ = uVar59;
  auVar42._12_4_ = uVar59;
  auVar42 = vsubps_avx512vl(auVar5,auVar42);
  fVar61 = auVar42._0_4_;
  auVar54._0_4_ = fVar61 * fVar3;
  fVar63 = auVar42._4_4_;
  auVar54._4_4_ = fVar63 * fVar3;
  fVar64 = auVar42._8_4_;
  auVar54._8_4_ = fVar64 * fVar3;
  fVar65 = auVar42._12_4_;
  auVar54._12_4_ = fVar65 * fVar3;
  auVar4 = vfmadd231ps_fma(auVar54,auVar41,auVar46);
  auVar4 = vfmadd231ps_fma(auVar4,auVar39,auVar45);
  local_380._0_4_ = auVar40._0_4_ * auVar4._0_4_;
  local_380._4_4_ = auVar40._4_4_ * auVar4._4_4_;
  local_380._8_4_ = auVar40._8_4_ * auVar4._8_4_;
  local_380._12_4_ = auVar40._12_4_ * auVar4._12_4_;
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar5._4_4_ = uVar59;
  auVar5._0_4_ = uVar59;
  auVar5._8_4_ = uVar59;
  auVar5._12_4_ = uVar59;
  uVar29 = vcmpps_avx512vl(local_380,auVar5,2);
  auVar40 = vpbroadcastd_avx512vl();
  uVar59 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar28._4_4_ = uVar59;
  auVar28._0_4_ = uVar59;
  auVar28._8_4_ = uVar59;
  auVar28._12_4_ = uVar59;
  uVar30 = vcmpps_avx512vl(local_380,auVar28,0xd);
  uVar31 = vpcmpgtd_avx512vl(auVar40,_DAT_01ff0cf0);
  bVar38 = (byte)uVar29 & (byte)uVar30 & 0xf & (byte)uVar31;
  if (bVar38 != 0) {
    auVar47 = vunpckhps_avx(auVar47,auVar48);
    auVar48 = vunpckhps_avx(auVar49,auVar51);
    auVar49._0_4_ = fVar27 * auVar48._0_4_;
    auVar49._4_4_ = fVar27 * auVar48._4_4_;
    auVar49._8_4_ = fVar27 * auVar48._8_4_;
    auVar49._12_4_ = fVar27 * auVar48._12_4_;
    auVar49 = vfmadd231ps_fma(auVar49,auVar58,auVar47);
    auVar47._0_4_ = fVar1 * local_380._0_4_;
    auVar47._4_4_ = fVar1 * local_380._4_4_;
    auVar47._8_4_ = fVar1 * local_380._8_4_;
    auVar47._12_4_ = fVar1 * local_380._12_4_;
    auVar51._0_4_ = fVar2 * local_380._0_4_;
    auVar51._4_4_ = fVar2 * local_380._4_4_;
    auVar51._8_4_ = fVar2 * local_380._8_4_;
    auVar51._12_4_ = fVar2 * local_380._12_4_;
    auVar52._0_4_ = fVar3 * local_380._0_4_;
    auVar52._4_4_ = fVar3 * local_380._4_4_;
    auVar52._8_4_ = fVar3 * local_380._8_4_;
    auVar52._12_4_ = fVar3 * local_380._12_4_;
    auVar47 = vsubps_avx(auVar39,auVar47);
    auVar48 = vsubps_avx(auVar41,auVar51);
    auVar40 = vsubps_avx(auVar42,auVar52);
    auVar53._0_4_ = auVar40._0_4_ * auVar40._0_4_;
    auVar53._4_4_ = auVar40._4_4_ * auVar40._4_4_;
    auVar53._8_4_ = auVar40._8_4_ * auVar40._8_4_;
    auVar53._12_4_ = auVar40._12_4_ * auVar40._12_4_;
    auVar48 = vfmadd231ps_fma(auVar53,auVar48,auVar48);
    auVar47 = vfmadd231ps_fma(auVar48,auVar47,auVar47);
    auVar48._0_4_ = auVar49._0_4_ * auVar49._0_4_;
    auVar48._4_4_ = auVar49._4_4_ * auVar49._4_4_;
    auVar48._8_4_ = auVar49._8_4_ * auVar49._8_4_;
    auVar48._12_4_ = auVar49._12_4_ * auVar49._12_4_;
    uVar29 = vcmpps_avx512vl(auVar47,auVar48,2);
    bVar38 = (byte)uVar29 & bVar38;
    if (bVar38 != 0) {
      auVar50._0_4_ = fVar61 * fVar61;
      auVar50._4_4_ = fVar63 * fVar63;
      auVar50._8_4_ = fVar64 * fVar64;
      auVar50._12_4_ = fVar65 * fVar65;
      auVar47 = vfmadd213ps_fma(auVar41,auVar41,auVar50);
      auVar47 = vfmadd213ps_fma(auVar39,auVar39,auVar47);
      uVar29 = vcmpps_avx512vl(auVar47,auVar48,6);
      if ((bVar38 & (byte)uVar29) != 0) {
        local_3a0 = ZEXT432(0) << 0x20;
        local_370[0] = -fVar1;
        local_370[1] = -fVar1;
        local_370[2] = -fVar1;
        local_370[3] = -fVar1;
        local_360[0] = -fVar2;
        local_360[1] = -fVar2;
        local_360[2] = -fVar2;
        local_360[3] = -fVar2;
        local_350[0] = -fVar3;
        local_350[1] = -fVar3;
        local_350[2] = -fVar3;
        local_350[3] = -fVar3;
        uVar36 = (ulong)(bVar38 & (byte)uVar29);
        auVar55 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
        auVar56 = ZEXT1632(CONCAT412(fVar27,CONCAT48(fVar27,CONCAT44(fVar27,fVar27))));
        auVar56 = vpcmpeqd_avx2(auVar56,auVar56);
        auVar57 = ZEXT3264(auVar56);
        do {
          local_3e0.hit = local_2c0;
          local_3e0.valid = (int *)local_340;
          uVar34 = 0;
          for (uVar32 = uVar36; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
            uVar34 = uVar34 + 1;
          }
          pGVar7 = (pSVar6->geometries).items[*(uint *)(local_3b0 + uVar34 * 4)].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
            uVar36 = uVar36 ^ 1L << (uVar34 & 0x3f);
            bVar37 = true;
          }
          else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                  (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            bVar37 = false;
          }
          else {
            uVar32 = (ulong)(uint)((int)uVar34 * 4);
            uVar59 = *(undefined4 *)(ray + k * 4 + 0x200);
            local_200 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_3a0 + uVar32)));
            local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_3a0 + uVar32 + 0x10)));
            *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_380 + uVar32);
            local_3e0.context = context->user;
            auVar43 = vpbroadcastd_avx512f();
            local_180 = vbroadcastss_avx512f
                                  (ZEXT416(*(uint *)((long)&(Disc->primIDs).field_0 + uVar32)));
            auVar44 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_370 + uVar32)));
            local_280 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_360 + uVar32)));
            local_240 = vbroadcastss_avx512f(ZEXT416(*(uint *)((long)local_350 + uVar32)));
            local_2c0[0] = (RTCHitN)auVar44[0];
            local_2c0[1] = (RTCHitN)auVar44[1];
            local_2c0[2] = (RTCHitN)auVar44[2];
            local_2c0[3] = (RTCHitN)auVar44[3];
            local_2c0[4] = (RTCHitN)auVar44[4];
            local_2c0[5] = (RTCHitN)auVar44[5];
            local_2c0[6] = (RTCHitN)auVar44[6];
            local_2c0[7] = (RTCHitN)auVar44[7];
            local_2c0[8] = (RTCHitN)auVar44[8];
            local_2c0[9] = (RTCHitN)auVar44[9];
            local_2c0[10] = (RTCHitN)auVar44[10];
            local_2c0[0xb] = (RTCHitN)auVar44[0xb];
            local_2c0[0xc] = (RTCHitN)auVar44[0xc];
            local_2c0[0xd] = (RTCHitN)auVar44[0xd];
            local_2c0[0xe] = (RTCHitN)auVar44[0xe];
            local_2c0[0xf] = (RTCHitN)auVar44[0xf];
            local_2c0[0x10] = (RTCHitN)auVar44[0x10];
            local_2c0[0x11] = (RTCHitN)auVar44[0x11];
            local_2c0[0x12] = (RTCHitN)auVar44[0x12];
            local_2c0[0x13] = (RTCHitN)auVar44[0x13];
            local_2c0[0x14] = (RTCHitN)auVar44[0x14];
            local_2c0[0x15] = (RTCHitN)auVar44[0x15];
            local_2c0[0x16] = (RTCHitN)auVar44[0x16];
            local_2c0[0x17] = (RTCHitN)auVar44[0x17];
            local_2c0[0x18] = (RTCHitN)auVar44[0x18];
            local_2c0[0x19] = (RTCHitN)auVar44[0x19];
            local_2c0[0x1a] = (RTCHitN)auVar44[0x1a];
            local_2c0[0x1b] = (RTCHitN)auVar44[0x1b];
            local_2c0[0x1c] = (RTCHitN)auVar44[0x1c];
            local_2c0[0x1d] = (RTCHitN)auVar44[0x1d];
            local_2c0[0x1e] = (RTCHitN)auVar44[0x1e];
            local_2c0[0x1f] = (RTCHitN)auVar44[0x1f];
            local_2c0[0x20] = (RTCHitN)auVar44[0x20];
            local_2c0[0x21] = (RTCHitN)auVar44[0x21];
            local_2c0[0x22] = (RTCHitN)auVar44[0x22];
            local_2c0[0x23] = (RTCHitN)auVar44[0x23];
            local_2c0[0x24] = (RTCHitN)auVar44[0x24];
            local_2c0[0x25] = (RTCHitN)auVar44[0x25];
            local_2c0[0x26] = (RTCHitN)auVar44[0x26];
            local_2c0[0x27] = (RTCHitN)auVar44[0x27];
            local_2c0[0x28] = (RTCHitN)auVar44[0x28];
            local_2c0[0x29] = (RTCHitN)auVar44[0x29];
            local_2c0[0x2a] = (RTCHitN)auVar44[0x2a];
            local_2c0[0x2b] = (RTCHitN)auVar44[0x2b];
            local_2c0[0x2c] = (RTCHitN)auVar44[0x2c];
            local_2c0[0x2d] = (RTCHitN)auVar44[0x2d];
            local_2c0[0x2e] = (RTCHitN)auVar44[0x2e];
            local_2c0[0x2f] = (RTCHitN)auVar44[0x2f];
            local_2c0[0x30] = (RTCHitN)auVar44[0x30];
            local_2c0[0x31] = (RTCHitN)auVar44[0x31];
            local_2c0[0x32] = (RTCHitN)auVar44[0x32];
            local_2c0[0x33] = (RTCHitN)auVar44[0x33];
            local_2c0[0x34] = (RTCHitN)auVar44[0x34];
            local_2c0[0x35] = (RTCHitN)auVar44[0x35];
            local_2c0[0x36] = (RTCHitN)auVar44[0x36];
            local_2c0[0x37] = (RTCHitN)auVar44[0x37];
            local_2c0[0x38] = (RTCHitN)auVar44[0x38];
            local_2c0[0x39] = (RTCHitN)auVar44[0x39];
            local_2c0[0x3a] = (RTCHitN)auVar44[0x3a];
            local_2c0[0x3b] = (RTCHitN)auVar44[0x3b];
            local_2c0[0x3c] = (RTCHitN)auVar44[0x3c];
            local_2c0[0x3d] = (RTCHitN)auVar44[0x3d];
            local_2c0[0x3e] = (RTCHitN)auVar44[0x3e];
            local_2c0[0x3f] = (RTCHitN)auVar44[0x3f];
            local_140 = vmovdqa64_avx512f(auVar43);
            local_100 = vbroadcastss_avx512f(ZEXT416((local_3e0.context)->instID[0]));
            local_c0 = vbroadcastss_avx512f(ZEXT416((local_3e0.context)->instPrimID[0]));
            local_340 = vmovdqa64_avx512f(auVar55);
            local_3e0.geometryUserPtr = pGVar7->userPtr;
            local_3e0.N = 0x10;
            local_300 = vmovdqa64_avx512f(auVar55);
            local_3e0.ray = (RTCRayN *)ray;
            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar56 = ZEXT1632(auVar57._0_16_);
              (*pGVar7->occlusionFilterN)(&local_3e0);
              auVar56 = vpcmpeqd_avx2(auVar56,auVar56);
              auVar57 = ZEXT3264(auVar56);
              auVar55 = vmovdqa64_avx512f(local_300);
            }
            auVar43 = vmovdqa64_avx512f(local_340);
            uVar29 = vptestmd_avx512f(auVar43,auVar43);
            if ((short)uVar29 == 0) {
              bVar37 = true;
            }
            else {
              p_Var11 = context->args->filter;
              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                auVar56 = ZEXT1632(auVar57._0_16_);
                (*p_Var11)(&local_3e0);
                auVar56 = vpcmpeqd_avx2(auVar56,auVar56);
                auVar57 = ZEXT3264(auVar56);
                auVar55 = vmovdqa64_avx512f(local_300);
              }
              auVar43 = vmovdqa64_avx512f(local_340);
              uVar32 = vptestmd_avx512f(auVar43,auVar43);
              auVar43 = vbroadcastss_avx512f(ZEXT416(0xff800000));
              bVar37 = (bool)((byte)uVar32 & 1);
              bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar32 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar32 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar32 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar32 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar32 >> 6) & 1);
              bVar18 = (bool)((byte)(uVar32 >> 7) & 1);
              bVar19 = (bool)((byte)(uVar32 >> 8) & 1);
              bVar20 = (bool)((byte)(uVar32 >> 9) & 1);
              bVar21 = (bool)((byte)(uVar32 >> 10) & 1);
              bVar22 = (bool)((byte)(uVar32 >> 0xb) & 1);
              bVar23 = (bool)((byte)(uVar32 >> 0xc) & 1);
              bVar24 = (bool)((byte)(uVar32 >> 0xd) & 1);
              bVar25 = (bool)((byte)(uVar32 >> 0xe) & 1);
              bVar26 = SUB81(uVar32 >> 0xf,0);
              *(uint *)(local_3e0.ray + 0x200) =
                   (uint)bVar37 * auVar43._0_4_ | (uint)!bVar37 * *(int *)(local_3e0.ray + 0x200);
              *(uint *)(local_3e0.ray + 0x204) =
                   (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * *(int *)(local_3e0.ray + 0x204);
              *(uint *)(local_3e0.ray + 0x208) =
                   (uint)bVar13 * auVar43._8_4_ | (uint)!bVar13 * *(int *)(local_3e0.ray + 0x208);
              *(uint *)(local_3e0.ray + 0x20c) =
                   (uint)bVar14 * auVar43._12_4_ | (uint)!bVar14 * *(int *)(local_3e0.ray + 0x20c);
              *(uint *)(local_3e0.ray + 0x210) =
                   (uint)bVar15 * auVar43._16_4_ | (uint)!bVar15 * *(int *)(local_3e0.ray + 0x210);
              *(uint *)(local_3e0.ray + 0x214) =
                   (uint)bVar16 * auVar43._20_4_ | (uint)!bVar16 * *(int *)(local_3e0.ray + 0x214);
              *(uint *)(local_3e0.ray + 0x218) =
                   (uint)bVar17 * auVar43._24_4_ | (uint)!bVar17 * *(int *)(local_3e0.ray + 0x218);
              *(uint *)(local_3e0.ray + 0x21c) =
                   (uint)bVar18 * auVar43._28_4_ | (uint)!bVar18 * *(int *)(local_3e0.ray + 0x21c);
              *(uint *)(local_3e0.ray + 0x220) =
                   (uint)bVar19 * auVar43._32_4_ | (uint)!bVar19 * *(int *)(local_3e0.ray + 0x220);
              *(uint *)(local_3e0.ray + 0x224) =
                   (uint)bVar20 * auVar43._36_4_ | (uint)!bVar20 * *(int *)(local_3e0.ray + 0x224);
              *(uint *)(local_3e0.ray + 0x228) =
                   (uint)bVar21 * auVar43._40_4_ | (uint)!bVar21 * *(int *)(local_3e0.ray + 0x228);
              *(uint *)(local_3e0.ray + 0x22c) =
                   (uint)bVar22 * auVar43._44_4_ | (uint)!bVar22 * *(int *)(local_3e0.ray + 0x22c);
              *(uint *)(local_3e0.ray + 0x230) =
                   (uint)bVar23 * auVar43._48_4_ | (uint)!bVar23 * *(int *)(local_3e0.ray + 0x230);
              *(uint *)(local_3e0.ray + 0x234) =
                   (uint)bVar24 * auVar43._52_4_ | (uint)!bVar24 * *(int *)(local_3e0.ray + 0x234);
              *(uint *)(local_3e0.ray + 0x238) =
                   (uint)bVar25 * auVar43._56_4_ | (uint)!bVar25 * *(int *)(local_3e0.ray + 0x238);
              *(uint *)(local_3e0.ray + 0x23c) =
                   (uint)bVar26 * auVar43._60_4_ | (uint)!bVar26 * *(int *)(local_3e0.ray + 0x23c);
              bVar37 = (short)uVar32 == 0;
            }
            if (bVar37 != false) {
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar59;
              uVar36 = uVar36 ^ 1L << (uVar34 & 0x3f);
            }
          }
        } while ((uVar36 != 0) && (bVar37 != false));
        return (bool)(bVar37 ^ 1);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0, Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }